

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O3

bool __thiscall
Parameter<std::pair<int,_int>_>::setData(Parameter<std::pair<int,_int>_> *this,pair<int,_int> pval)

{
  (this->super_ParameterBase).empty_ = false;
  *(int *)&(this->super_ParameterBase).field_0x2c = pval.first;
  *(int *)&this->field_0x30 = pval.second;
  return true;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }